

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singleton.h
# Opt level: O2

void __thiscall es::init::ActionOnZero::operator()(ActionOnZero *this)

{
  _func_void *p_Var1;
  atomic<bool> aVar2;
  singletons_meta_data *psVar3;
  
  aVar2._M_base._M_i = operator()::activated._M_base._M_i;
  LOCK();
  operator()::activated._M_base._M_i = (__atomic_base<bool>)true;
  UNLOCK();
  if (((byte)aVar2._M_base._M_i & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"ActionOnZero(): Already activated\n");
    return;
  }
  LOCK();
  _ZN2es4initL14clean_up_phaseE_0 = 1;
  UNLOCK();
  while( true ) {
    psVar3 = static_obj_stack<es::init::singletons_meta_data>::pop();
    if (psVar3 == (singletons_meta_data *)0x0) break;
    p_Var1 = psVar3->_func;
    if (p_Var1 != (_func_void *)0x0) {
      psVar3->_func = (_func_void *)0x0;
      (*p_Var1)();
    }
  }
  return;
}

Assistant:

void operator()() const
    {
        static std::atomic<bool> activated{false};

        if constexpr (verbose_singletons)
            std::cout << "ActionOnZero(): calling empty_stack(): from: " << __PRETTY_FUNCTION__ << "\n";
        if (activated.exchange(true))
        {
            std::cout << "ActionOnZero(): Already activated\n";
            return;
        }
        empty_stack();
    }